

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPNABase::OPNABase(OPNABase *this)

{
  Channel4 *this_00;
  OPNABase *this_01;
  long lVar1;
  
  OPNBase::OPNBase(&this->super_OPNBase);
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR_SetStatus_00213e28;
  lVar1 = 0x280;
  do {
    this_01 = (OPNABase *)((this->super_OPNBase).super_Timer.regta + lVar1 + -10);
    Channel4::Channel4((Channel4 *)this_01);
    lVar1 = lVar1 + 0x2e0;
  } while (lVar1 != 0x13c0);
  this->adpcmbuf = (uint8 *)0x0;
  this->memaddr = 0;
  this->startaddr = 0;
  this->adpcmvol = 0;
  this->deltan = 0x100;
  this->control2 = '\0';
  MakeTable2(this_01);
  BuildLFOTable();
  for (lVar1 = 0x280; lVar1 != 0x13c0; lVar1 = lVar1 + 0x2e0) {
    this_00 = (Channel4 *)((this->super_OPNBase).super_Timer.regta + lVar1 + -10);
    Channel4::SetChip(this_00,&(this->super_OPNBase).chip);
    Channel4::SetType(this_00,typeN);
  }
  return;
}

Assistant:

OPNABase::OPNABase()
{
	adpcmbuf = 0;
	memaddr = 0;
	startaddr = 0;
	deltan = 256;

	adpcmvol = 0;
	control2 = 0;

	MakeTable2();
	BuildLFOTable();
	for (int i=0; i<6; i++)
	{
		ch[i].SetChip(&chip);
		ch[i].SetType(typeN);
	}
}